

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ifc.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Iifc::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Iifc *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t cls;
  const_iterator __position;
  MthdVtxXy *pMVar1;
  MthdPaletteOffset *pMVar2;
  MthdIndexFormat *pMVar3;
  MthdIfcFormat *pMVar4;
  MthdOperation *pMVar5;
  MthdMissing *pMVar6;
  MthdCtxSurf2D *pMVar7;
  MthdCtxBeta4 *pMVar8;
  MthdCtxBeta *pMVar9;
  MthdCtxRop *pMVar10;
  MthdCtxPattern *pMVar11;
  MthdCtxClip *pMVar12;
  MthdCtxChroma *pMVar13;
  MthdDmaGrobj *pMVar14;
  MthdDmaNotify *pMVar15;
  MthdPmTrigger *pMVar16;
  MthdPatch *pMVar17;
  MthdNotify *pMVar18;
  MthdNop *pMVar19;
  result_type rVar20;
  MthdIfcSize *pMVar21;
  MthdIifcData *this_01;
  MthdDither *this_02;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar22;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_00;
  allocator_type local_45f;
  allocator local_45e;
  allocator local_45d;
  allocator local_45c;
  allocator local_45b;
  allocator local_45a;
  allocator local_459;
  allocator local_458;
  allocator local_457;
  allocator local_456;
  allocator local_455;
  allocator local_454;
  allocator local_453;
  allocator local_452;
  allocator local_451;
  allocator local_450;
  allocator local_44f;
  allocator local_44e;
  allocator local_44d;
  allocator local_44c;
  allocator local_44b;
  allocator local_44a;
  allocator local_449;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_448;
  MthdIfcSize *local_440;
  MthdVtxXy *local_438;
  MthdPaletteOffset *local_430;
  MthdIndexFormat *local_428;
  MthdIfcFormat *local_420;
  MthdOperation *local_418;
  MthdMissing *local_410;
  MthdCtxSurf2D *local_408;
  MthdCtxBeta4 *local_400;
  MthdCtxBeta *local_3f8;
  MthdCtxRop *local_3f0;
  MthdCtxPattern *local_3e8;
  MthdCtxClip *local_3e0;
  MthdCtxChroma *local_3d8;
  MthdDmaGrobj *local_3d0;
  MthdDmaNotify *local_3c8;
  MthdPmTrigger *local_3c0;
  MthdPatch *local_3b8;
  MthdNotify *local_3b0;
  MthdNop *local_3a8;
  string local_3a0;
  string local_380;
  string local_360;
  MthdDmaNotify *local_340;
  MthdDmaGrobj *local_338;
  MthdCtxChroma *local_330;
  MthdCtxClip *local_328;
  MthdCtxPattern *local_320;
  MthdCtxRop *local_318;
  MthdCtxBeta *local_310;
  MthdCtxBeta4 *local_308;
  MthdCtxSurf2D *local_300;
  MthdMissing *local_2f8;
  MthdOperation *local_2f0;
  MthdIfcFormat *local_2e8;
  MthdIndexFormat *local_2e0;
  MthdPaletteOffset *local_2d8;
  MthdVtxXy *local_2d0;
  MthdIfcSize *local_2c8;
  MthdIfcSize *local_2c0;
  MthdIifcData *local_2b8;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_448 = __return_storage_ptr__;
  local_3a8 = (MthdNop *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_380,"nop",&local_449);
  pMVar19 = local_3a8;
  opt = &(this->super_Class).opt;
  MthdNop::SingleMthdTest
            (local_3a8,opt,(uint32_t)rVar20,&local_380,-1,(this->super_Class).cls,0x100,1,4);
  local_360._M_dataplus._M_p = (pointer)pMVar19;
  local_3b0 = (MthdNotify *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3a0,"notify",&local_44a);
  pMVar18 = local_3b0;
  MthdNotify::SingleMthdTest
            (local_3b0,opt,(uint32_t)rVar20,&local_3a0,0,(this->super_Class).cls,0x104,1,4);
  local_360._M_string_length = (size_type)pMVar18;
  local_3b8 = (MthdPatch *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_50,"patch",&local_44b);
  pMVar17 = local_3b8;
  MthdPatch::SingleMthdTest
            (local_3b8,opt,(uint32_t)rVar20,&local_50,-1,(this->super_Class).cls,0x10c,1,4);
  local_360.field_2._M_allocated_capacity = (size_type)pMVar17;
  local_3c0 = (MthdPmTrigger *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_70,"pm_trigger",&local_44c);
  pMVar16 = local_3c0;
  MthdPmTrigger::SingleMthdTest
            (local_3c0,opt,(uint32_t)rVar20,&local_70,-1,(this->super_Class).cls,0x140,1,4);
  local_360.field_2._8_8_ = pMVar16;
  local_3c8 = (MthdDmaNotify *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_90,"dma_notify",&local_44d);
  pMVar15 = local_3c8;
  MthdDmaNotify::SingleMthdTest
            (local_3c8,opt,(uint32_t)rVar20,&local_90,1,(this->super_Class).cls,0x180,1,4);
  local_340 = pMVar15;
  local_3d0 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_b0,"dma_palette",&local_44e);
  pMVar14 = local_3d0;
  MthdDmaGrobj::MthdDmaGrobj
            (local_3d0,opt,(uint32_t)rVar20,&local_b0,2,(this->super_Class).cls,0x184,0,0);
  local_338 = pMVar14;
  local_3d8 = (MthdCtxChroma *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_d0,"ctx_chroma",&local_44f);
  pMVar13 = local_3d8;
  MthdCtxChroma::MthdCtxChroma
            (local_3d8,opt,(uint32_t)rVar20,&local_d0,3,(this->super_Class).cls,0x188,true);
  local_330 = pMVar13;
  local_3e0 = (MthdCtxClip *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_f0,"ctx_clip",&local_450);
  pMVar12 = local_3e0;
  MthdCtxClip::SingleMthdTest
            (local_3e0,opt,(uint32_t)rVar20,&local_f0,4,(this->super_Class).cls,0x18c,1,4);
  local_328 = pMVar12;
  local_3e8 = (MthdCtxPattern *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_110,"ctx_pattern",&local_451);
  pMVar11 = local_3e8;
  MthdCtxPattern::MthdCtxPattern
            (local_3e8,opt,(uint32_t)rVar20,&local_110,5,(this->super_Class).cls,400,true);
  local_320 = pMVar11;
  local_3f0 = (MthdCtxRop *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_130,"ctx_rop",&local_452);
  pMVar10 = local_3f0;
  MthdCtxRop::SingleMthdTest
            (local_3f0,opt,(uint32_t)rVar20,&local_130,6,(this->super_Class).cls,0x194,1,4);
  local_318 = pMVar10;
  local_3f8 = (MthdCtxBeta *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_150,"ctx_beta",&local_453);
  pMVar9 = local_3f8;
  MthdCtxBeta::SingleMthdTest
            (local_3f8,opt,(uint32_t)rVar20,&local_150,7,(this->super_Class).cls,0x198,1,4);
  local_310 = pMVar9;
  local_400 = (MthdCtxBeta4 *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_170,"ctx_beta4",&local_454);
  pMVar8 = local_400;
  MthdCtxBeta4::SingleMthdTest
            (local_400,opt,(uint32_t)rVar20,&local_170,8,(this->super_Class).cls,0x19c,1,4);
  local_308 = pMVar8;
  local_408 = (MthdCtxSurf2D *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_190,"ctx_surf2d",&local_455);
  pMVar7 = local_408;
  cls = (this->super_Class).cls;
  MthdCtxSurf2D::MthdCtxSurf2D
            (local_408,opt,(uint32_t)rVar20,&local_190,9,cls,0x1a0,cls != 0x60 | 2);
  local_300 = pMVar7;
  local_410 = (MthdMissing *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1b0,"missing",&local_456);
  pMVar6 = local_410;
  MthdMissing::SingleMthdTest
            (local_410,opt,(uint32_t)rVar20,&local_1b0,-1,(this->super_Class).cls,0x200,1,4);
  local_2f8 = pMVar6;
  local_418 = (MthdOperation *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1d0,"operation",&local_457);
  pMVar5 = local_418;
  MthdOperation::MthdOperation
            (local_418,opt,(uint32_t)rVar20,&local_1d0,10,(this->super_Class).cls,0x3e4,true);
  local_2f0 = pMVar5;
  local_420 = (MthdIfcFormat *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1f0,"format",&local_458);
  pMVar4 = local_420;
  MthdIfcFormat::MthdIfcFormat
            (local_420,opt,(uint32_t)rVar20,&local_1f0,0xb,(this->super_Class).cls,1000,true);
  local_2e8 = pMVar4;
  local_428 = (MthdIndexFormat *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_210,"index_format",&local_459);
  pMVar3 = local_428;
  MthdIndexFormat::SingleMthdTest
            (local_428,opt,(uint32_t)rVar20,&local_210,0xc,(this->super_Class).cls,0x3ec,1,4);
  local_2e0 = pMVar3;
  local_430 = (MthdPaletteOffset *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_230,"palette_offset",&local_45a);
  pMVar2 = local_430;
  MthdPaletteOffset::SingleMthdTest
            (local_430,opt,(uint32_t)rVar20,&local_230,0xd,(this->super_Class).cls,0x3f0,1,4);
  local_2d8 = pMVar2;
  local_438 = (MthdVtxXy *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_250,"xy",&local_45b);
  pMVar1 = local_438;
  MthdVtxXy::MthdVtxXy
            (local_438,opt,(uint32_t)rVar20,&local_250,0xe,(this->super_Class).cls,0x3f4,1,4,0x21);
  local_2d0 = pMVar1;
  local_440 = (MthdIfcSize *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_270,"size_out",&local_45c);
  pMVar21 = local_440;
  MthdIfcSize::MthdIfcSize
            (local_440,opt,(uint32_t)rVar20,&local_270,0xf,(this->super_Class).cls,0x3f8,4);
  local_2c8 = pMVar21;
  pMVar21 = (MthdIfcSize *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_290,"size_in",&local_45d);
  MthdIfcSize::MthdIfcSize
            (pMVar21,opt,(uint32_t)rVar20,&local_290,0x10,(this->super_Class).cls,0x3fc,2);
  local_2c0 = pMVar21;
  this_01 = (MthdIifcData *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2b0,"iifc_data",&local_45e);
  MthdIifcData::SingleMthdTest
            (this_01,opt,(uint32_t)rVar20,&local_2b0,0x11,(this->super_Class).cls,0x400,0x700,4);
  pvVar22 = local_448;
  __l._M_len = 0x16;
  __l._M_array = (iterator)&local_360;
  local_2b8 = this_01;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_448,__l,&local_45f);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  if ((char)(this->super_Class).cls == 'd') {
    __position._M_current =
         (pvVar22->
         super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    this_02 = (MthdDither *)operator_new(0x25950);
    rVar20 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    std::__cxx11::string::string((string *)&local_360,"dither",(allocator *)&local_3a0);
    MthdDither::SingleMthdTest
              (this_02,opt,(uint32_t)rVar20,&local_360,0x12,(this->super_Class).cls,0x3e0,1,4);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_380;
    local_380._M_dataplus._M_p = (pointer)this_02;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(local_448,__position,__l_00);
    std::__cxx11::string::~string((string *)&local_360);
    pvVar22 = local_448;
  }
  return pvVar22;
}

Assistant:

std::vector<SingleMthdTest *> Iifc::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_palette", 2, cls, 0x184, 0, DMA_R),
		new MthdCtxChroma(opt, rnd(), "ctx_chroma", 3, cls, 0x188, true),
		new MthdCtxClip(opt, rnd(), "ctx_clip", 4, cls, 0x18c),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 5, cls, 0x190, true),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 6, cls, 0x194),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 7, cls, 0x198),
		new MthdCtxBeta4(opt, rnd(), "ctx_beta4", 8, cls, 0x19c),
		new MthdCtxSurf2D(opt, rnd(), "ctx_surf2d", 9, cls, 0x1a0, (cls == 0x60 ? SURF2D_NV4 : SURF2D_NV10) | SURF2D_SWZOK),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdOperation(opt, rnd(), "operation", 10, cls, 0x3e4, true),
		new MthdIfcFormat(opt, rnd(), "format", 11, cls, 0x3e8, true),
		new MthdIndexFormat(opt, rnd(), "index_format", 12, cls, 0x3ec),
		new MthdPaletteOffset(opt, rnd(), "palette_offset", 13, cls, 0x3f0),
		new MthdVtxXy(opt, rnd(), "xy", 14, cls, 0x3f4, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdIfcSize(opt, rnd(), "size_out", 15, cls, 0x3f8, IFC_OUT),
		new MthdIfcSize(opt, rnd(), "size_in", 16, cls, 0x3fc, IFC_IN),
		new MthdIifcData(opt, rnd(), "iifc_data", 17, cls, 0x400, 0x700),
	};
	if ((cls & 0xff) == 0x64) {
		res.insert(res.end(), {
			new MthdDither(opt, rnd(), "dither", 18, cls, 0x3e0),
		});
	}
	return res;
}